

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.c++
# Opt level: O0

bool __thiscall kj::_::Mutex::checkPredicate(Mutex *this,Waiter *waiter)

{
  bool bVar1;
  NullableValue<kj::Exception> *other;
  Exception *pEVar2;
  anon_class_16_2_758bdefe *func;
  undefined1 local_3a0 [40];
  Exception *exception;
  Event **local_368;
  Waiter *local_360;
  Maybe<kj::Exception> local_358;
  undefined1 local_1c0 [8];
  NullableValue<kj::Exception> _exception124;
  bool result;
  Waiter *waiter_local;
  Mutex *this_local;
  
  bVar1 = Maybe<kj::Own<kj::Exception,_std::nullptr_t>_>::operator==(&waiter->exception);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    _exception124.field_1._398_1_ = 0;
    local_368 = (Event **)((long)&_exception124.field_1 + 0x18e);
    local_360 = waiter;
    runCatchingExceptions<kj::_::Mutex::checkPredicate(kj::_::Mutex::Waiter&)::__0>
              (&local_358,(kj *)&stack0xfffffffffffffc98,func);
    other = readMaybe<kj::Exception>(&local_358);
    NullableValue<kj::Exception>::NullableValue((NullableValue<kj::Exception> *)local_1c0,other);
    Maybe<kj::Exception>::~Maybe(&local_358);
    pEVar2 = _::NullableValue::operator_cast_to_Exception_((NullableValue *)local_1c0);
    if (pEVar2 != (Exception *)0x0) {
      local_3a0._32_8_ =
           NullableValue<kj::Exception>::operator*((NullableValue<kj::Exception> *)local_1c0);
      _exception124.field_1._398_1_ = 1;
      pEVar2 = mv<kj::Exception>((Exception *)local_3a0._32_8_);
      heap<kj::Exception>((kj *)local_3a0,pEVar2);
      Maybe<kj::Own<kj::Exception,_std::nullptr_t>_>::Maybe
                ((Maybe<kj::Own<kj::Exception,_std::nullptr_t>_> *)(local_3a0 + 0x10),
                 (Own<kj::Exception,_std::nullptr_t> *)local_3a0);
      Maybe<kj::Own<kj::Exception,_std::nullptr_t>_>::operator=
                (&waiter->exception,
                 (Maybe<kj::Own<kj::Exception,_std::nullptr_t>_> *)(local_3a0 + 0x10));
      Maybe<kj::Own<kj::Exception,_std::nullptr_t>_>::~Maybe
                ((Maybe<kj::Own<kj::Exception,_std::nullptr_t>_> *)(local_3a0 + 0x10));
      Own<kj::Exception,_std::nullptr_t>::~Own((Own<kj::Exception,_std::nullptr_t> *)local_3a0);
    }
    NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)local_1c0);
    this_local._7_1_ = (bool)(_exception124.field_1._398_1_ & 1);
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool Mutex::checkPredicate(Waiter& waiter) {
  // Run the predicate from a thread other than the waiting thread, returning true if it's time to
  // signal the waiting thread. This is not only when the predicate passes, but also when it
  // throws, in which case we want to propagate the exception to the waiting thread.

  if (waiter.exception != kj::none) return true;  // don't run again after an exception

  bool result = false;
  KJ_IF_SOME(exception, kj::runCatchingExceptions([&]() {
    result = waiter.predicate.check();
  })) {
    // Exception thrown.
    result = true;
    waiter.exception = kj::heap(kj::mv(exception));
  };
  return result;
}